

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O3

void __thiscall MidiPlayerDialog::dropEvent(MidiPlayerDialog *this,QDropEvent *e)

{
  QPoint *pQVar1;
  undefined8 uVar2;
  char cVar3;
  uint uVar4;
  long lVar5;
  QPoint pos;
  QStringList fileNames;
  undefined8 local_58;
  QArrayDataPointer<QString> local_50;
  undefined8 local_38;
  QArrayDataPointer<QUrl> local_30;
  
  if ((e[0xc] == (QDropEvent)0x0) && (Master::isSupportedDropEvent(e), e[0xc] != (QDropEvent)0x1)) {
    return;
  }
  QMimeData::urls();
  Master::parseMidiListFromUrls((QStringList *)&local_50,(QList<QUrl> *)&local_30);
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_30);
  if (local_50.size == 0) {
    e[0xc] = (QDropEvent)0x0;
  }
  else {
    local_58 = CONCAT44((int)((double)((ulong)*(double *)(e + 0x18) & 0x8000000000000000 |
                                      0x3fe0000000000000) + *(double *)(e + 0x18)),
                        (int)((double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 |
                                      0x3fe0000000000000) + *(double *)(e + 0x10)));
    cVar3 = QRect::contains((QPoint *)(*(long *)(*(long *)(this->ui + 0x18) + 0x20) + 0x14),
                            SUB81(&local_58,0));
    if (cVar3 != '\0') {
      pQVar1 = *(QPoint **)(this->ui + 0x18);
      local_38 = QWidget::mapFromParent(pQVar1);
      lVar5 = QListWidget::itemAt(pQVar1);
      if (lVar5 != 0) {
        uVar4 = QListWidget::row(*(QListWidgetItem **)(this->ui + 0x18));
        QListWidget::insertItems((int)*(undefined8 *)(this->ui + 0x18),(QList *)(ulong)uVar4);
        goto LAB_001666ee;
      }
    }
    uVar2 = *(undefined8 *)(this->ui + 0x18);
    uVar4 = QListWidget::count();
    QListWidget::insertItems((int)uVar2,(QList *)(ulong)uVar4);
    uVar2 = *(undefined8 *)(this->ui + 0x18);
    QListWidget::count();
    QListWidget::setCurrentRow((int)uVar2);
    updateCurrentItem(this);
  }
LAB_001666ee:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_50);
  return;
}

Assistant:

void MidiPlayerDialog::dropEvent(QDropEvent *e) {
	if (!e->isAccepted()) {
		Master::isSupportedDropEvent(e);
		if (!e->isAccepted()) return;
	}
	QStringList fileNames = Master::parseMidiListFromUrls(e->mimeData()->urls());
	if (fileNames.isEmpty()) {
		e->ignore();
		return;
	}

#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
	const QPoint pos = e->pos();
#else
	const QPoint pos = e->position().toPoint();
#endif
	const bool dropToMidiList = ui->playList->geometry().contains(pos);
	if (dropToMidiList) {
		QListWidgetItem *dropItem = ui->playList->itemAt(ui->playList->mapFromParent(pos));
		if (dropItem != NULL) {
			int dropRow = ui->playList->row(dropItem);
			ui->playList->insertItems(dropRow, fileNames);
			return;
		}
	}
	ui->playList->addItems(fileNames);
	ui->playList->setCurrentRow(ui->playList->count() - 1);
	updateCurrentItem();
}